

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

RPCHelpMan * wallet::sendmany(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffd958;
  allocator<RPCArg> *paVar2;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffd960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd970;
  RPCResults *in_stack_ffffffffffffd980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd990;
  UniValue *in_stack_ffffffffffffd998;
  iterator in_stack_ffffffffffffd9a0;
  RPCArgOptions *in_stack_ffffffffffffd9a8;
  string *in_stack_ffffffffffffd9b0;
  undefined7 in_stack_ffffffffffffd9b8;
  undefined1 in_stack_ffffffffffffd9bf;
  undefined4 in_stack_ffffffffffffd9c0;
  Type in_stack_ffffffffffffd9c4;
  string *in_stack_ffffffffffffd9c8;
  undefined4 in_stack_ffffffffffffd9d0;
  Type in_stack_ffffffffffffd9d4;
  undefined4 in_stack_ffffffffffffd9d8;
  Type in_stack_ffffffffffffd9dc;
  RPCArg *in_stack_ffffffffffffd9e0;
  RPCArgOptions *in_stack_ffffffffffffda00;
  undefined1 *local_25c0;
  undefined1 *local_25a8;
  undefined1 *local_2590;
  undefined1 *local_2578;
  RPCExamples *in_stack_ffffffffffffdaa0;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_22b0 [35];
  undefined1 local_228d;
  undefined1 local_228c;
  undefined1 local_228b;
  undefined1 local_228a [33];
  allocator<char> local_2269 [31];
  allocator<char> local_224a;
  allocator<char> local_2249 [30];
  allocator<char> local_222b;
  allocator<char> local_222a;
  allocator<char> local_2229 [17];
  undefined8 local_2218;
  allocator<char> local_220b;
  allocator<char> local_220a;
  allocator<char> local_2209 [26];
  allocator<char> local_21ef;
  undefined1 local_21ee;
  allocator<char> local_21ed;
  allocator<char> local_21ec;
  allocator<char> local_21eb;
  allocator<char> local_21ea;
  allocator<char> local_21e9;
  allocator<char> local_21e8;
  allocator<char> local_21e7;
  allocator<char> local_21e6;
  undefined1 local_21e5 [2];
  allocator<char> local_21e3 [2];
  allocator<char> local_21e1 [8];
  allocator<char> local_21d9 [32];
  allocator<char> local_21b9;
  undefined4 local_21b8;
  allocator<char> local_21b2;
  allocator<char> local_21b1;
  undefined4 local_21b0;
  allocator<char> local_21aa;
  allocator<char> local_21a9;
  undefined4 local_21a8;
  allocator<char> local_21a2 [2];
  undefined4 local_21a0;
  allocator<char> local_2199 [32];
  allocator<char> local_2179;
  undefined4 local_2178;
  allocator<char> local_2174;
  allocator<char> local_2173;
  allocator<char> local_2172;
  allocator<char> local_2171 [32];
  allocator<char> local_2151 [337];
  undefined8 local_2000;
  undefined1 local_1c50 [272];
  undefined1 local_1b40 [192];
  undefined1 local_1a80 [272];
  undefined1 local_1970 [40];
  undefined8 local_1948;
  undefined8 uStack_1940;
  undefined8 local_1938;
  undefined1 local_1930;
  undefined1 local_192f;
  undefined1 local_1830;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined1 local_17f0;
  undefined1 local_17ef;
  undefined1 local_1708;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 local_16d0;
  undefined1 local_16c8;
  undefined1 local_16c7;
  undefined1 local_1588;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 local_1550;
  undefined1 local_1548;
  undefined1 local_1547;
  undefined1 local_1480;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  undefined1 local_1440;
  undefined1 local_143f;
  allocator<RPCArg> local_1378 [40];
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined1 local_1338;
  undefined1 local_1337;
  undefined1 local_1330;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  undefined1 local_12f0;
  undefined1 local_12ef;
  undefined1 local_1248 [264];
  undefined1 local_1140 [160];
  undefined1 local_10a0;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined1 local_1060;
  undefined1 local_105f;
  undefined8 local_1000;
  undefined1 local_fb8;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined1 local_f78;
  undefined1 local_f77;
  allocator<RPCArg> local_ed0 [40];
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined1 local_e90;
  undefined1 local_e8f;
  undefined1 local_e88;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined1 local_e48;
  undefined1 local_e47;
  undefined1 local_d80 [264];
  undefined1 local_c78 [160];
  undefined1 local_bd8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined1 local_b98;
  undefined1 local_b97;
  undefined1 local_a98 [2640];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_2000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::operator+(&in_stack_ffffffffffffd9a8->skip_type_check,&in_stack_ffffffffffffd9a0->m_names);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  UniValue::UniValue<const_char_(&)[3],_char[3],_true>
            ((UniValue *)in_stack_ffffffffffffd9a0,(char (*) [3])in_stack_ffffffffffffd998);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,in_stack_ffffffffffffd960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_bd8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_bb0 = 0;
  uStack_ba8 = 0;
  local_ba0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd958);
  local_b98 = 0;
  local_b97 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_2178 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,&in_stack_ffffffffffffd960->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_21a0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,&in_stack_ffffffffffffd960->typ);
  std::operator+(&in_stack_ffffffffffffd9a8->skip_type_check,&in_stack_ffffffffffffd9a0->m_names);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  local_e88 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_e60 = 0;
  uStack_e58 = 0;
  local_e50 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd958);
  local_e48 = 0;
  local_e47 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffd958);
  __l._M_len = (size_type)in_stack_ffffffffffffd9a8;
  __l._M_array = in_stack_ffffffffffffd9a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd998,__l,
             (allocator_type *)in_stack_ffffffffffffd990);
  local_ed0[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_ea8 = 0;
  uStack_ea0 = 0;
  local_e98 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffd958);
  local_e90 = 0;
  local_e8f = 0;
  paVar2 = local_ed0;
  RPCArg::RPCArg(in_stack_ffffffffffffd9e0,
                 (string *)CONCAT44(in_stack_ffffffffffffd9dc,in_stack_ffffffffffffd9d8),
                 in_stack_ffffffffffffd9d4,(Fallback *)in_stack_ffffffffffffd9c8,
                 (string *)CONCAT44(in_stack_ffffffffffffd9c4,in_stack_ffffffffffffd9c0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffda00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_21a8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,&in_stack_ffffffffffffd960->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_fb8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_f90 = 0;
  uStack_f88 = 0;
  local_f80 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_f78 = 0;
  local_f77 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_21b0._0_1_ = true;
  local_21b0._1_1_ = false;
  local_21b0._2_2_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,&in_stack_ffffffffffffd960->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_10a0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_1078 = 0;
  uStack_1070 = 0;
  local_1068 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1060 = 0;
  local_105f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_21b8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,&in_stack_ffffffffffffd960->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_21e1[1] = (allocator<char>)0x1;
  local_21e1[2] = (allocator<char>)0x0;
  local_21e1[3] = (allocator<char>)0x0;
  local_21e1[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,&in_stack_ffffffffffffd960->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_1330 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_1308 = 0;
  uStack_1300 = 0;
  local_12f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_12f0 = 0;
  local_12ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_00._M_len = (size_type)in_stack_ffffffffffffd9a8;
  __l_00._M_array = in_stack_ffffffffffffd9a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd998,__l_00,
             (allocator_type *)in_stack_ffffffffffffd990);
  local_1378[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_1350 = 0;
  uStack_1348 = 0;
  local_1340 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1338 = 0;
  local_1337 = 0;
  paVar2 = local_1378;
  RPCArg::RPCArg(in_stack_ffffffffffffd9e0,
                 (string *)CONCAT44(in_stack_ffffffffffffd9dc,in_stack_ffffffffffffd9d8),
                 in_stack_ffffffffffffd9d4,(Fallback *)in_stack_ffffffffffffd9c8,
                 (string *)CONCAT44(in_stack_ffffffffffffd9c4,in_stack_ffffffffffffd9c0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffda00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd960);
  fun = (RPCMethodImpl *)local_21e5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_1480 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_1458 = 0;
  uStack_1450 = 0;
  local_1448 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1440 = 0;
  local_143f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_1588 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_1560 = 0;
  uStack_1558 = 0;
  local_1550 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1548 = 0;
  local_1547 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>
            ((UniValue *)in_stack_ffffffffffffd9a0,(char (*) [6])in_stack_ffffffffffffd998);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,in_stack_ffffffffffffd960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  common::FeeModesDetail((string *)in_stack_ffffffffffffd9a8);
  std::operator+((char *)in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
  local_1708 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_16e0 = 0;
  uStack_16d8 = 0;
  local_16d0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_16c8 = 0;
  local_16c7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd960);
  std::operator+(&in_stack_ffffffffffffd9a8->skip_type_check,&in_stack_ffffffffffffd9a0->m_names);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  local_1830 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_1808 = 0;
  uStack_1800 = 0;
  local_17f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_17f0 = 0;
  local_17ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_21ee = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffd998,(bool *)in_stack_ffffffffffffd990);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffd968,in_stack_ffffffffffffd960);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_1970[0] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffd970);
  local_1948 = 0;
  uStack_1940 = 0;
  local_1938 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1930 = 0;
  local_192f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
                 in_stack_ffffffffffffd9c8,in_stack_ffffffffffffd9c4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8),
                 in_stack_ffffffffffffd9b0,in_stack_ffffffffffffd9a8);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len = (size_type)in_stack_ffffffffffffd9a8;
  __l_01._M_array = in_stack_ffffffffffffd9a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd998,__l_01,
             (allocator_type *)in_stack_ffffffffffffd990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_2229._1_8_ = 0;
  local_2229._9_8_ = 0;
  local_2218._0_1_ = '\0';
  local_2218._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd9e0,
             (string *)CONCAT44(in_stack_ffffffffffffd9dc,in_stack_ffffffffffffd9d8),
             in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9c8,
             (string *)CONCAT44(in_stack_ffffffffffffd9c4,in_stack_ffffffffffffd9c0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_2269[1] = (allocator<char>)0x0;
  local_2269[2] = (allocator<char>)0x0;
  local_2269[3] = (allocator<char>)0x0;
  local_2269[4] = (allocator<char>)0x0;
  local_2269[5] = (allocator<char>)0x0;
  local_2269[6] = (allocator<char>)0x0;
  local_2269[7] = (allocator<char>)0x0;
  local_2269[8] = (allocator<char>)0x0;
  local_2269._9_8_ = 0;
  local_2269._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd9e0,in_stack_ffffffffffffd9dc,
             (string *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
             in_stack_ffffffffffffd9c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd9c4,in_stack_ffffffffffffd9c0),
             (bool)in_stack_ffffffffffffd9bf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  local_228a._2_8_ = (pointer)0x0;
  local_228a._10_8_ = (pointer)0x0;
  local_228a._18_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd9e0,in_stack_ffffffffffffd9dc,
             (string *)CONCAT44(in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9d0),
             in_stack_ffffffffffffd9c8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffd9c4,in_stack_ffffffffffffd9c0),
             (bool)in_stack_ffffffffffffd9bf);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_02._M_len = (size_type)in_stack_ffffffffffffd9a8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffd9a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd998,__l_02,
             (allocator_type *)in_stack_ffffffffffffd990);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffd9e0,
             (string *)CONCAT44(in_stack_ffffffffffffd9dc,in_stack_ffffffffffffd9d8),
             in_stack_ffffffffffffd9d4,in_stack_ffffffffffffd9c8,
             (string *)CONCAT44(in_stack_ffffffffffffd9c4,in_stack_ffffffffffffd9c0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffd9bf,in_stack_ffffffffffffd9b8));
  results._M_len = (size_type)in_stack_ffffffffffffd9a8;
  results._M_array = (iterator)in_stack_ffffffffffffd9a0;
  RPCResults::RPCResults(in_stack_ffffffffffffd980,results);
  this_00 = (RPCHelpMan *)local_228a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::operator+(&in_stack_ffffffffffffd9a8->skip_type_check,&in_stack_ffffffffffffd9a0->m_names);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  HelpExampleCli(in_stack_ffffffffffffd990,in_stack_ffffffffffffd988);
  std::operator+((char *)in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  name = (string *)&local_228b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::operator+(&in_stack_ffffffffffffd9a8->skip_type_check,&in_stack_ffffffffffffd9a0->m_names);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  HelpExampleCli(in_stack_ffffffffffffd990,in_stack_ffffffffffffd988);
  std::operator+(in_stack_ffffffffffffd990,in_stack_ffffffffffffd988);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  description = (string *)&local_228c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::operator+(&in_stack_ffffffffffffd9a8->skip_type_check,&in_stack_ffffffffffffd9a0->m_names);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  HelpExampleCli(in_stack_ffffffffffffd990,in_stack_ffffffffffffd988);
  std::operator+(in_stack_ffffffffffffd990,in_stack_ffffffffffffd988);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_228d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd9a8,(char *)in_stack_ffffffffffffd9a0,
             (allocator<char> *)in_stack_ffffffffffffd998);
  std::operator+(&in_stack_ffffffffffffd9a8->skip_type_check,&in_stack_ffffffffffffd9a0->m_names);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,in_stack_ffffffffffffd968);
  std::operator+(in_stack_ffffffffffffd970,(char *)in_stack_ffffffffffffd968);
  HelpExampleRpc(in_stack_ffffffffffffd990,in_stack_ffffffffffffd988);
  std::operator+(in_stack_ffffffffffffd990,in_stack_ffffffffffffd988);
  RPCExamples::RPCExamples((RPCExamples *)paVar2,(string *)0x55e784);
  this = (RPCArg *)local_22b0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::sendmany()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffd968,(anon_class_1_0_00000001 *)in_stack_ffffffffffffd960);
  RPCHelpMan::RPCHelpMan
            (this_00,name,description,args,(RPCResults *)this,in_stack_ffffffffffffdaa0,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_228d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_228c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_228b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_228a);
  RPCResults::~RPCResults((RPCResults *)this);
  puVar1 = local_1970;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != local_1a80);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd968);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_2578 = local_1b40;
  do {
    local_2578 = local_2578 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2578 != local_1c50);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd968);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_228a + 0x20));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2269);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd968);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_224a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2249);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_222b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_222a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2229);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffd968);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_220b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_220a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2209);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd968);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_2590 = local_48;
  do {
    local_2590 = local_2590 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_2590 != local_a98);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21ef);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21ed);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21ec);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21eb);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21ea);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21e9);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21e8);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21e7);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21e6);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_21e5);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_21e5 + 1));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_21e3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd968);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_25a8 = local_1140;
  do {
    local_25a8 = local_25a8 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_25a8 != local_1248);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_21e1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_21d9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21b9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21b2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21b1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21aa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_21a9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_21a2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffd968);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_25c0 = local_c78;
  do {
    local_25c0 = local_25c0 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_25c0 != local_d80);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2199);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2179);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2174);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::allocator<char>::~allocator(&local_2173);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2172);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2171);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2151);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan sendmany()
{
    return RPCHelpMan{"sendmany",
        "Send multiple times. Amounts are double-precision floating point numbers." +
        HELP_REQUIRING_PASSPHRASE,
                {
                    {"dummy", RPCArg::Type::STR, RPCArg::Default{"\"\""}, "Must be set to \"\" for backwards compatibility.",
                     RPCArgOptions{
                         .oneline_description = "\"\"",
                     }},
                    {"amounts", RPCArg::Type::OBJ_USER_KEYS, RPCArg::Optional::NO, "The addresses and amounts",
                        {
                            {"address", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "The bitcoin address is the key, the numeric amount (can be string) in " + CURRENCY_UNIT + " is the value"},
                        },
                    },
                    {"minconf", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "Ignored dummy value"},
                    {"comment", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "A comment"},
                    {"subtractfeefrom", RPCArg::Type::ARR, RPCArg::Optional::OMITTED, "The addresses.\n"
                                       "The fee will be equally deducted from the amount of each selected address.\n"
                                       "Those recipients will receive less bitcoins than you enter in their corresponding amount field.\n"
                                       "If no addresses are specified here, the sender pays the fee.",
                        {
                            {"address", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Subtract fee from this address"},
                        },
                    },
                    {"replaceable", RPCArg::Type::BOOL, RPCArg::DefaultHint{"wallet default"}, "Signal that this transaction can be replaced by a transaction (BIP 125)"},
                    {"conf_target", RPCArg::Type::NUM, RPCArg::DefaultHint{"wallet -txconfirmtarget"}, "Confirmation target in blocks"},
                    {"estimate_mode", RPCArg::Type::STR, RPCArg::Default{"unset"}, "The fee estimate mode, must be one of (case insensitive):\n"
                      + FeeModesDetail(std::string("economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used"))},
                    {"fee_rate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_ATOM + "/vB."},
                    {"verbose", RPCArg::Type::BOOL, RPCArg::Default{false}, "If true, return extra information about the transaction."},
                },
                {
                    RPCResult{"if verbose is not set or set to false",
                        RPCResult::Type::STR_HEX, "txid", "The transaction id for the send. Only 1 transaction is created regardless of\n"
                "the number of addresses."
                    },
                    RPCResult{"if verbose is set to true",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR_HEX, "txid", "The transaction id for the send. Only 1 transaction is created regardless of\n"
                "the number of addresses."},
                            {RPCResult::Type::STR, "fee_reason", "The transaction fee reason."}
                        },
                    },
                },
                RPCExamples{
            "\nSend two amounts to two different addresses:\n"
            + HelpExampleCli("sendmany", "\"\" \"{\\\"" + EXAMPLE_ADDRESS[0] + "\\\":0.01,\\\"" + EXAMPLE_ADDRESS[1] + "\\\":0.02}\"") +
            "\nSend two amounts to two different addresses setting the confirmation and comment:\n"
            + HelpExampleCli("sendmany", "\"\" \"{\\\"" + EXAMPLE_ADDRESS[0] + "\\\":0.01,\\\"" + EXAMPLE_ADDRESS[1] + "\\\":0.02}\" 6 \"testing\"") +
            "\nSend two amounts to two different addresses, subtract fee from amount:\n"
            + HelpExampleCli("sendmany", "\"\" \"{\\\"" + EXAMPLE_ADDRESS[0] + "\\\":0.01,\\\"" + EXAMPLE_ADDRESS[1] + "\\\":0.02}\" 1 \"\" \"[\\\"" + EXAMPLE_ADDRESS[0] + "\\\",\\\"" + EXAMPLE_ADDRESS[1] + "\\\"]\"") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("sendmany", "\"\", {\"" + EXAMPLE_ADDRESS[0] + "\":0.01,\"" + EXAMPLE_ADDRESS[1] + "\":0.02}, 6, \"testing\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    if (!request.params[0].isNull() && !request.params[0].get_str().empty()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Dummy value must be set to \"\"");
    }
    UniValue sendTo = request.params[1].get_obj();

    mapValue_t mapValue;
    if (!request.params[3].isNull() && !request.params[3].get_str().empty())
        mapValue["comment"] = request.params[3].get_str();

    CCoinControl coin_control;
    if (!request.params[5].isNull()) {
        coin_control.m_signal_bip125_rbf = request.params[5].get_bool();
    }

    SetFeeEstimateMode(*pwallet, coin_control, /*conf_target=*/request.params[6], /*estimate_mode=*/request.params[7], /*fee_rate=*/request.params[8], /*override_min_fee=*/false);

    std::vector<CRecipient> recipients = CreateRecipients(
            ParseOutputs(sendTo),
            InterpretSubtractFeeFromOutputInstructions(request.params[4], sendTo.getKeys())
    );
    const bool verbose{request.params[9].isNull() ? false : request.params[9].get_bool()};

    return SendMoney(*pwallet, coin_control, recipients, std::move(mapValue), verbose);
},
    };
}